

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::clara::TextFlow::Column::iterator::calcLength(iterator *this)

{
  char cVar1;
  Column *pCVar2;
  ulong uVar3;
  pointer pbVar4;
  size_t sVar5;
  bool bVar6;
  long lVar7;
  size_t sVar8;
  ulong uVar9;
  size_t sVar10;
  size_t sVar11;
  
  pCVar2 = this->m_column;
  uVar3 = this->m_stringIndex;
  pbVar4 = (pCVar2->m_strings).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(pCVar2->m_strings).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar4 >> 5) <= uVar3) {
    __assert_fail("m_stringIndex < m_column.m_strings.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tomjnixon[P]actorpp/submodules/catch2/catch.hpp"
                  ,0x2150,"void Catch::clara::TextFlow::Column::iterator::calcLength()");
  }
  this->m_suffix = false;
  sVar5 = this->m_pos;
  if ((sVar5 != 0 || uVar3 != 0) || (sVar10 = pCVar2->m_initialIndent, sVar10 == 0xffffffffffffffff)
     ) {
    sVar10 = pCVar2->m_indent;
  }
  sVar11 = pCVar2->m_width;
  this->m_end = sVar5;
  lVar7 = *(long *)&pbVar4[uVar3]._M_dataplus;
  sVar8 = sVar5;
  if (*(char *)(lVar7 + sVar5) == '\n') {
    sVar8 = sVar5 + 1;
    this->m_end = sVar8;
  }
  sVar11 = sVar11 - sVar10;
  uVar3 = *(size_type *)((long)(pbVar4 + uVar3) + 8);
  uVar9 = sVar8;
  if (sVar8 < uVar3) {
    do {
      uVar9 = sVar8;
      if (*(char *)(lVar7 + sVar8) == '\n') break;
      sVar8 = sVar8 + 1;
      this->m_end = sVar8;
      uVar9 = uVar3;
    } while (uVar3 != sVar8);
  }
  sVar10 = sVar11;
  if (uVar9 < sVar11 + sVar5) {
    sVar10 = uVar9 - sVar5;
    goto LAB_00140878;
  }
  for (; sVar10 != 0; sVar10 = sVar10 - 1) {
    bVar6 = isBoundary(this,this->m_pos + sVar10);
    if (bVar6) goto LAB_0014088c;
  }
  goto LAB_0014086e;
  while (sVar10 = sVar10 - 1, sVar10 != 0) {
LAB_0014088c:
    cVar1 = *(char *)((sVar10 - 1) +
                     *(long *)&(this->m_column->m_strings).
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[this->m_stringIndex].
                               _M_dataplus + this->m_pos);
    if (isWhitespace(char)::chars_abi_cxx11_ == '\0') {
      calcLength();
    }
    lVar7 = ::std::__cxx11::string::find(-0x68,(ulong)(uint)(int)cVar1);
    if (lVar7 == -1) goto LAB_00140878;
  }
LAB_0014086e:
  this->m_suffix = true;
  sVar10 = sVar11 - 1;
LAB_00140878:
  this->m_len = sVar10;
  return;
}

Assistant:

void calcLength() {
			assert(m_stringIndex < m_column.m_strings.size());

			m_suffix = false;
			auto width = m_column.m_width - indent();
			m_end = m_pos;
			if (line()[m_pos] == '\n') {
				++m_end;
			}
			while (m_end < line().size() && line()[m_end] != '\n')
				++m_end;

			if (m_end < m_pos + width) {
				m_len = m_end - m_pos;
			} else {
				size_t len = width;
				while (len > 0 && !isBoundary(m_pos + len))
					--len;
				while (len > 0 && isWhitespace(line()[m_pos + len - 1]))
					--len;

				if (len > 0) {
					m_len = len;
				} else {
					m_suffix = true;
					m_len = width - 1;
				}
			}
		}